

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_benchmark.c
# Opt level: O2

int main(void)

{
  __time_t _Var1;
  __syscall_slong_t _Var2;
  roaring_bitmap_t *r;
  long lVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  timespec ts;
  
  clock_gettime(3,(timespec *)&ts);
  _Var2 = ts.tv_nsec;
  _Var1 = ts.tv_sec;
  lVar3 = 1000000;
  while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
    r = roaring_bitmap_create();
    roaring_bitmap_free(r);
  }
  clock_gettime(3,(timespec *)&ts);
  lVar3 = (ts.tv_sec - _Var1) * 1000000000 + (ts.tv_nsec - _Var2);
  auVar5._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar5._0_8_ = lVar3;
  auVar5._12_4_ = 0x45300000;
  printf("%f cycles per object created \n",
         ((auVar5._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) / 1000000.0);
  return 0;
}

Assistant:

int main() {
    size_t N = 1000000;
    uint64_t cycles_start, cycles_final;

    RDTSC_START(cycles_start);
    for (size_t i = 0; i < N; i++) {
        roaring_bitmap_t* bm = roaring_bitmap_create();
        roaring_bitmap_free(bm);
    }
    RDTSC_FINAL(cycles_final);
    printf("%f cycles per object created \n",
           (cycles_final - cycles_start) * 1.0 / N);
    return 0;
}